

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O3

void ON_SortFloatArray(sort_algorithm sort_algorithm,float *a,size_t nel)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float *lostk [62];
  undefined8 auStack_3e8 [62];
  undefined8 auStack_1f8 [63];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (float *)0x0) {
      uVar4 = nel >> 1;
      pfVar3 = a + (nel - 1);
      uVar5 = nel - 1;
      do {
        if (uVar4 == 0) {
          fVar12 = *pfVar3;
          *pfVar3 = *a;
          uVar5 = uVar5 - 1;
          if (uVar5 == 0) {
            *a = fVar12;
            return;
          }
          pfVar3 = pfVar3 + -1;
          uVar4 = 0;
        }
        else {
          fVar12 = a[uVar4 - 1];
          uVar4 = uVar4 - 1;
        }
        pfVar6 = a + uVar4;
        uVar10 = uVar4;
        while (uVar1 = uVar10 * 2, uVar1 < uVar5) {
          uVar10 = uVar1 | 1;
          pfVar7 = a + uVar1 + 1;
          if ((uVar10 < uVar5) && (*pfVar7 <= a[uVar1 + 2] && a[uVar1 + 2] != *pfVar7)) {
            pfVar7 = a + uVar1 + 2;
            uVar10 = uVar1 + 2;
          }
          if (*pfVar7 <= fVar12) break;
          *pfVar6 = *pfVar7;
          pfVar6 = pfVar7;
        }
        *pfVar6 = fVar12;
      } while( true );
    }
  }
  else if (1 < nel && a != (float *)0x0) {
    uVar4 = 0;
    pfVar3 = a + (nel - 1);
LAB_005b10ad:
    while( true ) {
      iVar2 = (int)uVar4;
      uVar5 = ((long)pfVar3 - (long)a >> 2) + 1;
      if (uVar5 < 9) break;
      pfVar6 = (float *)((long)a + (uVar5 & 0xfffffffffffffffe) * 2);
      fVar12 = *a;
      fVar13 = *pfVar6;
      fVar11 = fVar12;
      if (fVar13 < fVar12) {
        *a = fVar13;
        *pfVar6 = fVar12;
        fVar11 = *a;
        fVar13 = fVar12;
      }
      fVar12 = *pfVar3;
      if (fVar12 < fVar11) {
        *a = fVar12;
        *pfVar3 = fVar11;
        fVar13 = *pfVar6;
        fVar12 = fVar11;
      }
      pfVar7 = a;
      pfVar8 = pfVar3;
      if (fVar12 < fVar13) {
        *pfVar6 = fVar12;
        *pfVar3 = fVar13;
      }
LAB_005b1115:
      if (pfVar7 < pfVar6) {
        do {
          pfVar7 = pfVar7 + 1;
          if (pfVar6 <= pfVar7) break;
        } while (*pfVar7 <= *pfVar6);
      }
      if (pfVar6 <= pfVar7) {
        do {
          pfVar7 = pfVar7 + 1;
          if (pfVar3 < pfVar7) break;
        } while (*pfVar7 <= *pfVar6);
      }
      do {
        pfVar9 = pfVar8;
        pfVar8 = pfVar9 + -1;
        if (pfVar8 <= pfVar6) break;
      } while (*pfVar6 <= *pfVar8 && *pfVar8 != *pfVar6);
      if (pfVar7 <= pfVar8) {
        fVar12 = *pfVar7;
        *pfVar7 = *pfVar8;
        *pfVar8 = fVar12;
        if (pfVar8 == pfVar6) {
          pfVar6 = pfVar7;
        }
        goto LAB_005b1115;
      }
      if (pfVar6 < pfVar9) {
        while (pfVar9 = pfVar8, pfVar6 < pfVar9) {
          if ((*pfVar9 != *pfVar6) || (pfVar8 = pfVar9 + -1, NAN(*pfVar9) || NAN(*pfVar6))) break;
        }
      }
      if (pfVar9 <= pfVar6) {
        while (pfVar9 = pfVar9 + -1, a < pfVar9) {
          if ((*pfVar9 != *pfVar6) || (NAN(*pfVar9) || NAN(*pfVar6))) break;
        }
      }
      if ((long)pfVar9 - (long)a < (long)pfVar3 - (long)pfVar7) goto LAB_005b1260;
      if (a < pfVar9) {
        auStack_1f8[iVar2] = a;
        auStack_3e8[iVar2] = pfVar9;
        uVar4 = (ulong)(iVar2 + 1);
      }
      iVar2 = (int)uVar4;
      a = pfVar7;
      if (pfVar3 <= pfVar7) goto LAB_005b1283;
    }
    if (a < pfVar3) {
      do {
        pfVar6 = a;
        if (a + 1 <= pfVar3) {
          fVar12 = *a;
          pfVar7 = a + 1;
          do {
            fVar11 = *pfVar7;
            pfVar8 = pfVar7;
            if (*pfVar7 <= fVar12) {
              fVar11 = fVar12;
              pfVar8 = pfVar6;
            }
            pfVar6 = pfVar8;
            fVar12 = fVar11;
            pfVar7 = pfVar7 + 1;
          } while (pfVar7 <= pfVar3);
        }
        fVar12 = *pfVar6;
        *pfVar6 = *pfVar3;
        *pfVar3 = fVar12;
        pfVar3 = pfVar3 + -1;
      } while (a < pfVar3);
    }
    goto LAB_005b1283;
  }
  return;
LAB_005b1260:
  if (pfVar7 < pfVar3) {
    auStack_1f8[iVar2] = pfVar7;
    auStack_3e8[iVar2] = pfVar3;
    uVar4 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar4;
  pfVar3 = pfVar9;
  if (pfVar9 <= a) {
LAB_005b1283:
    if (iVar2 < 1) {
      return;
    }
    uVar4 = (ulong)(iVar2 - 1);
    a = (float *)auStack_1f8[uVar4];
    pfVar3 = (float *)auStack_3e8[uVar4];
  }
  goto LAB_005b10ad;
}

Assistant:

void ON_SortFloatArray( 
        ON::sort_algorithm sort_algorithm,
        float* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_float(a,nel);
  else
    ON_qsort_float(a,nel);
}